

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYElement::addProperty(PLYElement *this,PLYProperty *p)

{
  value_type *in_RDI;
  vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
  *unaff_retaddr;
  
  std::
  vector<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
  ::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addProperty(const PLYProperty &p) { list.push_back(p); }